

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglTestPackage.cpp
# Opt level: O1

int __thiscall deqp::egl::PerformanceTests::init(PerformanceTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  
  pTVar1 = (TestNode *)operator_new(0x78);
  MakeCurrentPerfTests::MakeCurrentPerfTests
            ((MakeCurrentPerfTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  GLES2SharedRenderingPerfTests::GLES2SharedRenderingPerfTests
            ((GLES2SharedRenderingPerfTests *)pTVar1,(this->super_TestCaseGroup).m_eglTestCtx);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new MakeCurrentPerfTests			(m_eglTestCtx));
		addChild(new GLES2SharedRenderingPerfTests	(m_eglTestCtx));
	}